

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::ArraySeriesMatcher::ArraySeriesMatcher
          (ArraySeriesMatcher *this,MatcherArray *matchers,int32_t matchersLen)

{
  (this->super_SeriesMatcher).super_CompositionMatcher.super_NumberParseMatcher.
  _vptr_NumberParseMatcher = (_func_int **)&PTR__ArraySeriesMatcher_003cf018;
  MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::MaybeStackArray
            (&this->fMatchers,matchers);
  this->fMatchersLen = matchersLen;
  return;
}

Assistant:

ArraySeriesMatcher::ArraySeriesMatcher(MatcherArray& matchers, int32_t matchersLen)
        : fMatchers(std::move(matchers)), fMatchersLen(matchersLen) {
}